

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int xar_cleanup(archive_read *a)

{
  void *__ptr;
  undefined8 *puVar1;
  int iVar2;
  unknown_tag *tag;
  hdlink *next;
  int r;
  int i;
  hdlink *hdlink;
  xar *xar;
  archive_read *a_local;
  
  __ptr = a->format->data;
  checksum_cleanup(a);
  iVar2 = decompression_cleanup(a);
  _r = *(undefined8 **)((long)__ptr + 0x1c8);
  while (_r != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*_r;
    free(_r);
    _r = puVar1;
  }
  for (next._4_4_ = 0; next._4_4_ < *(int *)((long)__ptr + 0x1bc); next._4_4_ = next._4_4_ + 1) {
    file_free(*(xar_file **)(*(long *)((long)__ptr + 0x1b0) + (long)next._4_4_ * 8));
  }
  free(*(void **)((long)__ptr + 0x1b0));
  while (*(long *)((long)__ptr + 0x30) != 0) {
    puVar1 = *(undefined8 **)((long)__ptr + 0x30);
    *(undefined8 *)((long)__ptr + 0x30) = *puVar1;
    archive_string_free((archive_string *)(puVar1 + 1));
    free(puVar1);
  }
  free(*(void **)((long)__ptr + 0x20));
  free(__ptr);
  a->format->data = (void *)0x0;
  return iVar2;
}

Assistant:

static int
xar_cleanup(struct archive_read *a)
{
	struct xar *xar;
	struct hdlink *hdlink;
	int i;
	int r;

	xar = (struct xar *)(a->format->data);
	checksum_cleanup(a);
	r = decompression_cleanup(a);
	hdlink = xar->hdlink_list;
	while (hdlink != NULL) {
		struct hdlink *next = hdlink->next;

		free(hdlink);
		hdlink = next;
	}
	for (i = 0; i < xar->file_queue.used; i++)
		file_free(xar->file_queue.files[i]);
	free(xar->file_queue.files);
	while (xar->unknowntags != NULL) {
		struct unknown_tag *tag;

		tag = xar->unknowntags;
		xar->unknowntags = tag->next;
		archive_string_free(&(tag->name));
		free(tag);
	}
	free(xar->outbuff);
	free(xar);
	a->format->data = NULL;
	return (r);
}